

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isStruct(Type *this)

{
  Type *pTVar1;
  
  pTVar1 = getCanonicalType(this);
  return ((pTVar1->super_Symbol).kind & ~Root) == PackedStructType;
}

Assistant:

bool Type::isStruct() const {
    const Type& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
            return true;
        default:
            return false;
    }
}